

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * INT_create_transform_action_spec
                 (FMStructDescList format_list,FMStructDescList out_format_list,char *function)

{
  size_t sVar1;
  char *__s;
  FMStructDescRec *in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  char *str;
  int i;
  int format_count;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  char *local_28;
  int local_20;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (in_RDI != 0) {
      bVar2 = *(long *)(in_RDI + (long)(int)local_1c * 0x20) != 0;
    }
    if (!bVar2) break;
    local_1c = local_1c + 1;
  }
  local_28 = (char *)INT_CMmalloc((size_t)in_stack_ffffffffffffffb0);
  sprintf(local_28,"Transform Action   Input Format Count %d\n",(ulong)local_1c);
  for (local_20 = 0; local_20 < (int)local_1c; local_20 = local_20 + 1) {
    local_28 = add_FMfieldlist_to_string(in_RSI,in_RDX);
  }
  local_1c = 0;
  while (*(long *)(in_RSI + (long)(int)local_1c * 0x20) != 0) {
    local_1c = local_1c + 1;
  }
  strlen(local_28);
  local_28 = (char *)INT_CMrealloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar1 = strlen(local_28);
  sprintf(local_28 + sVar1,"  Output Format Count %d\n",(ulong)local_1c);
  for (local_20 = 0; local_20 < (int)local_1c; local_20 = local_20 + 1) {
    local_28 = add_FMfieldlist_to_string(in_RSI,in_RDX);
  }
  sVar1 = strlen(local_28);
  strlen((char *)in_RDX);
  __s = (char *)INT_CMrealloc(local_28,sVar1);
  sVar1 = strlen(__s);
  strcpy(__s + sVar1,(char *)in_RDX);
  return __s;
}

Assistant:

char *
INT_create_transform_action_spec(FMStructDescList format_list, FMStructDescList out_format_list, char *function)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list && format_list[format_count].format_name != NULL)
	format_count++;
    str = malloc(50);
    sprintf(str, "Transform Action   Input Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }

    format_count = 0;
    while(out_format_list[format_count].format_name != NULL) format_count++;
    str = realloc(str, strlen(str) + 30);
    sprintf(str + strlen(str), "  Output Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &out_format_list[i]);
    }
    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}